

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void UA_Server_browseNext_single
               (UA_Server *server,UA_Session *session,UA_Boolean releaseContinuationPoint,
               UA_ByteString *continuationPoint,UA_BrowseResult *result)

{
  ContinuationPointEntry *pCVar1;
  UA_Boolean UVar2;
  ContinuationPointEntry *temp;
  ContinuationPointEntry *cp;
  UA_BrowseResult *result_local;
  UA_ByteString *continuationPoint_local;
  UA_Boolean releaseContinuationPoint_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  result->statusCode = 0x804a0000;
  pCVar1 = (session->continuationPoints).lh_first;
  do {
    temp = pCVar1;
    if (temp == (ContinuationPointEntry *)0x0) {
      return;
    }
    pCVar1 = (temp->pointers).le_next;
    UVar2 = UA_ByteString_equal(&temp->identifier,continuationPoint);
  } while (!UVar2);
  result->statusCode = 0;
  if (releaseContinuationPoint) {
    removeCp(temp,session);
  }
  else {
    Service_Browse_single(server,session,temp,(UA_BrowseDescription *)0x0,0,result);
  }
  return;
}

Assistant:

static void
UA_Server_browseNext_single(UA_Server *server, UA_Session *session, UA_Boolean releaseContinuationPoint,
                            const UA_ByteString *continuationPoint, UA_BrowseResult *result) {
    result->statusCode = UA_STATUSCODE_BADCONTINUATIONPOINTINVALID;
    struct ContinuationPointEntry *cp, *temp;
    LIST_FOREACH_SAFE(cp, &session->continuationPoints, pointers, temp) {
        if(UA_ByteString_equal(&cp->identifier, continuationPoint)) {
            result->statusCode = UA_STATUSCODE_GOOD;
            if(!releaseContinuationPoint)
                Service_Browse_single(server, session, cp, NULL, 0, result);
            else
                removeCp(cp, session);
            break;
        }
    }
}